

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O2

void Am_Show_Alert_Dialog(Am_Value_List *alert_texts,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Object *this;
  Am_Object the_dialog;
  Am_Value dummy;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  the_dialog.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Value_List::Empty(&cached_alert_dialogs);
  if (bVar1) {
    Am_Object::Create((Am_Object *)&dummy,(char *)&Am_Alert_Dialog);
    Am_Object::operator=(&the_dialog,(Am_Object *)&dummy);
    Am_Object::~Am_Object((Am_Object *)&dummy);
  }
  else {
    Am_Value_List::Pop((Am_Value_List *)&dummy,true);
    Am_Object::operator=(&the_dialog,&dummy);
    Am_Value::~Am_Value(&dummy);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(alert_texts);
  Am_Object::Set(&the_dialog,0xa2,pAVar2,0);
  Am_Object::Get_Object((Am_Object *)&dummy,(Am_Slot_Key)&the_dialog,0xc5);
  this = Am_Object::Set((Am_Object *)&dummy,0xca,do_stop_waiting_for_dialog.from_wrapper,0);
  Am_Object::Set(this,0xc9,do_abort_waiting_for_dialog.from_wrapper,0);
  Am_Object::~Am_Object((Am_Object *)&dummy);
  Am_Object::Am_Object(&local_28,&the_dialog);
  Am_Object::Add_Part(&Am_Screen,&local_28,true,0);
  Am_Object::~Am_Object(&local_28);
  set_dialog_position(&the_dialog,x,y);
  dummy.type = 0;
  dummy.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Object::Am_Object(&local_30,&the_dialog);
  Am_Pop_Up_Window_And_Wait(&local_30,&dummy,modal);
  Am_Object::~Am_Object(&local_30);
  Am_Object::Am_Object(&local_38,&the_dialog);
  Am_Object::Remove_Part(&Am_Screen,&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&the_dialog);
  Am_Value_List::Push(&cached_alert_dialogs,pAVar2,true);
  Am_Value::~Am_Value(&dummy);
  Am_Object::~Am_Object(&the_dialog);
  return;
}

Assistant:

void
Am_Show_Alert_Dialog(Am_Value_List alert_texts,
                     int x /* = Am_AT_CENTER_SCREEN*/,
                     int y /*= Am_AT_CENTER_SCREEN*/, bool modal /*= false*/)
{
  Am_Object the_dialog;
  if (cached_alert_dialogs.Empty())
    the_dialog = Am_Alert_Dialog.Create();
  else {
    the_dialog = cached_alert_dialogs.Pop();
  }
  the_dialog.Set(Am_ITEMS, alert_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(the_dialog, dummy, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_alert_dialogs.Push(the_dialog);
}